

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

BreakIterator * icu_63::BreakIterator::makeInstance(Locale *loc,int32_t kind,UErrorCode *status)

{
  int32_t iVar1;
  int iVar2;
  size_t sVar3;
  FilteredBreakIteratorBuilder *pFVar4;
  undefined4 extraout_var;
  BreakIterator *pBVar5;
  BreakIterator *pBVar6;
  char *type;
  UErrorCode kvStatus;
  char lbKeyValue [32];
  char lbType [32];
  
  if (U_ZERO_ERROR < *status) {
    return (BreakIterator *)0x0;
  }
  switch(kind) {
  case 0:
    type = "grapheme";
    break;
  case 1:
    type = "word";
    break;
  case 2:
    lbType._4_4_ = SUB84(lbType._0_8_,4) & 0xffffff00;
    builtin_strncpy(lbType,"line",4);
    lbKeyValue[0x10] = '\0';
    lbKeyValue[0x11] = '\0';
    lbKeyValue[0x12] = '\0';
    lbKeyValue[0x13] = '\0';
    lbKeyValue[0x14] = '\0';
    lbKeyValue[0x15] = '\0';
    lbKeyValue[0x16] = '\0';
    lbKeyValue[0x17] = '\0';
    lbKeyValue[0x18] = '\0';
    lbKeyValue[0x19] = '\0';
    lbKeyValue[0x1a] = '\0';
    lbKeyValue[0x1b] = '\0';
    lbKeyValue[0x1c] = '\0';
    lbKeyValue[0x1d] = '\0';
    lbKeyValue[0x1e] = '\0';
    lbKeyValue[0x1f] = '\0';
    lbKeyValue[0] = '\0';
    lbKeyValue[1] = '\0';
    lbKeyValue[2] = '\0';
    lbKeyValue[3] = '\0';
    lbKeyValue[4] = '\0';
    lbKeyValue[5] = '\0';
    lbKeyValue[6] = '\0';
    lbKeyValue[7] = '\0';
    lbKeyValue[8] = '\0';
    lbKeyValue[9] = '\0';
    lbKeyValue[10] = '\0';
    lbKeyValue[0xb] = '\0';
    lbKeyValue[0xc] = '\0';
    lbKeyValue[0xd] = '\0';
    lbKeyValue[0xe] = '\0';
    lbKeyValue[0xf] = '\0';
    kvStatus = U_ZERO_ERROR;
    iVar1 = Locale::getKeywordValue(loc,"lb",lbKeyValue,0x20,&kvStatus);
    if (((0 < iVar1) && (kvStatus < U_ILLEGAL_ARGUMENT_ERROR)) &&
       ((iVar2 = bcmp(lbKeyValue,"strict",7), iVar2 == 0 ||
        ((iVar2 = bcmp(lbKeyValue,"normal",7), iVar2 == 0 ||
         (iVar2 = bcmp(lbKeyValue,"loose",6), iVar2 == 0)))))) {
      sVar3 = strlen(lbType);
      (lbType + sVar3)[0] = '_';
      (lbType + sVar3)[1] = '\0';
      strcat(lbType,lbKeyValue);
    }
    type = lbType;
    break;
  case 3:
    pBVar5 = buildInstance(loc,"sentence",status);
    lbType[0x10] = '\0';
    lbType[0x11] = '\0';
    lbType[0x12] = '\0';
    lbType[0x13] = '\0';
    lbType[0x14] = '\0';
    lbType[0x15] = '\0';
    lbType[0x16] = '\0';
    lbType[0x17] = '\0';
    lbType[0x18] = '\0';
    lbType[0x19] = '\0';
    lbType[0x1a] = '\0';
    lbType[0x1b] = '\0';
    lbType[0x1c] = '\0';
    lbType[0x1d] = '\0';
    lbType[0x1e] = '\0';
    lbType[0x1f] = '\0';
    lbType[0] = '\0';
    lbType[1] = '\0';
    lbType[2] = '\0';
    lbType[3] = '\0';
    lbType[4] = '\0';
    lbType[5] = '\0';
    lbType[6] = '\0';
    lbType[7] = '\0';
    lbType[8] = '\0';
    lbType[9] = '\0';
    lbType[10] = '\0';
    lbType[0xb] = '\0';
    lbType[0xc] = '\0';
    lbType[0xd] = '\0';
    lbType[0xe] = '\0';
    lbType[0xf] = '\0';
    lbKeyValue._0_8_ = lbKeyValue._0_8_ & 0xffffffff00000000;
    iVar1 = Locale::getKeywordValue(loc,"ss",lbType,0x20,(UErrorCode *)lbKeyValue);
    if (((0 < iVar1) && ((int)lbKeyValue._0_4_ < 1)) &&
       (iVar2 = bcmp(lbType,"standard",9), iVar2 == 0)) {
      pFVar4 = FilteredBreakIteratorBuilder::createInstance(loc,(UErrorCode *)lbKeyValue);
      if ((int)lbKeyValue._0_4_ < 1) {
        iVar2 = (*(pFVar4->super_UObject)._vptr_UObject[5])(pFVar4,pBVar5,status);
        pBVar5 = (BreakIterator *)CONCAT44(extraout_var,iVar2);
        (*(pFVar4->super_UObject)._vptr_UObject[1])(pFVar4);
      }
    }
    goto LAB_002ed9e1;
  case 4:
    type = "title";
    break;
  default:
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    pBVar5 = (BreakIterator *)0x0;
    goto LAB_002ed9e1;
  }
  pBVar5 = buildInstance(loc,type,status);
LAB_002ed9e1:
  pBVar6 = (BreakIterator *)0x0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pBVar6 = pBVar5;
  }
  return pBVar6;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }